

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

void __thiscall Triangle::Triangle(Triangle *this,mat4 *ltw,vec3 *v0,vec3 *v1,vec3 *v2,ColorRGB c)

{
  vec3 *pvVar1;
  int local_e0;
  tvec4<float> local_dc;
  tvec4<float> local_cc;
  tvec3<float> local_bc;
  int local_b0;
  tvec4<float> local_ac;
  tvec4<float> local_9c;
  tvec3<float> local_8c;
  int local_80;
  tvec4<float> local_7c;
  tvec4<float> local_6c;
  tvec3<float> local_5c;
  vec3 *local_50;
  vec3 *v2_local;
  vec3 *v1_local;
  vec3 *v0_local;
  mat4 *ltw_local;
  Triangle *this_local;
  float local_1c;
  undefined8 local_14;
  ColorRGB c_local;
  
  local_1c = c.b;
  register0x00001200 = c._0_8_;
  local_50 = v2;
  v2_local = v1;
  v1_local = v0;
  v0_local = (vec3 *)ltw;
  ltw_local = (mat4 *)this;
  local_14 = register0x00001200;
  c_local.r = local_1c;
  ColorRGB::ColorRGB(&this->color);
  glm::detail::tvec3<float>::tvec3(&this->v2);
  glm::detail::tvec3<float>::tvec3(&this->e2);
  glm::detail::tvec3<float>::tvec3(&this->n);
  glm::detail::tvec3<float>::tvec3(&this->e1);
  glm::detail::tvec3<float>::tvec3(&this->v0);
  glm::detail::tvec3<float>::tvec3(&this->e0);
  glm::detail::tvec3<float>::tvec3(&this->v1);
  pvVar1 = v0_local;
  local_80 = 1;
  glm::detail::tvec4<float>::tvec4<float,int>(&local_7c,v0,&local_80);
  glm::detail::operator*((detail *)&local_6c,(tmat4x4<float> *)pvVar1,&local_7c);
  glm::detail::tvec3<float>::tvec3<float>(&local_5c,&local_6c);
  glm::detail::tvec3<float>::operator=(&this->v0,&local_5c);
  pvVar1 = v0_local;
  local_b0 = 1;
  glm::detail::tvec4<float>::tvec4<float,int>(&local_ac,v1,&local_b0);
  glm::detail::operator*((detail *)&local_9c,(tmat4x4<float> *)pvVar1,&local_ac);
  glm::detail::tvec3<float>::tvec3<float>(&local_8c,&local_9c);
  glm::detail::tvec3<float>::operator=(&this->v1,&local_8c);
  pvVar1 = v0_local;
  local_e0 = 1;
  glm::detail::tvec4<float>::tvec4<float,int>(&local_dc,v2,&local_e0);
  glm::detail::operator*((detail *)&local_cc,(tmat4x4<float> *)pvVar1,&local_dc);
  glm::detail::tvec3<float>::tvec3<float>(&local_bc,&local_cc);
  glm::detail::tvec3<float>::operator=(&this->v2,&local_bc);
  (this->color).r = (float)(undefined4)local_14;
  (this->color).g = (float)local_14._4_4_;
  (this->color).b = c_local.r;
  _calculateNormal(this);
  _calculateEdges(this);
  return;
}

Assistant:

Triangle::Triangle(
    const glm::mat4 &ltw,
    glm::vec3 v0,
    glm::vec3 v1,
    glm::vec3 v2,
    ColorRGB c) {
    
    this->v0 = glm::vec3(ltw * glm::vec4(v0, 1));
    this->v1 = glm::vec3(ltw * glm::vec4(v1, 1));
    this->v2 = glm::vec3(ltw * glm::vec4(v2, 1));
    
    color = c;
    
//     std::cout << "v0: (" << this->v0.x << ", " << this->v0.y << ", " << this->v0.z << ") ";
//     std::cout << "v1: (" << this->v1.x << ", " << this->v1.y << ", " << this->v1.z << ") ";
//     std::cout << "v2: (" << this->v2.x << ", " << this->v2.y << ", " << this->v2.z << ") ";
  
    _calculateNormal();
    _calculateEdges();
}